

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O3

void __thiscall Jinx::Impl::Lexer::ParseNumber(Lexer *this)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  byte bVar4;
  bool bVar5;
  size_t sVar6;
  long lVar7;
  uint uVar8;
  char *pcVar9;
  Lexer *this_00;
  double number;
  double local_58;
  String local_50;
  
  pcVar9 = this->m_current;
  cVar1 = *pcVar9;
  uVar8 = (uint)(cVar1 == '.');
  sVar6 = GetUtf8CharSize(pcVar9);
  pcVar2 = this->m_current;
  this_00 = (Lexer *)(pcVar2 + sVar6);
  this->m_current = (char *)this_00;
  this->m_columnNumber = this->m_columnNumber + 1;
  bVar4 = pcVar2[sVar6];
  if ((bVar4 != 0) && (uVar3 = (uint)(cVar1 == '.'), this_00 <= (Lexer *)this->m_end)) {
    while ((uVar8 = uVar3, bVar4 == 0x2e || (bVar4 - 0x30 < 10))) {
      uVar8 = uVar8 + (bVar4 == 0x2e);
      sVar6 = GetUtf8CharSize((char *)this_00);
      pcVar2 = this->m_current;
      this_00 = (Lexer *)(pcVar2 + sVar6);
      this->m_current = (char *)this_00;
      this->m_columnNumber = this->m_columnNumber + 1;
      bVar4 = pcVar2[sVar6];
      if ((bVar4 == 0) || (uVar3 = uVar8, (Lexer *)this->m_end < this_00)) goto LAB_001f6d57;
    }
    bVar5 = IsName(this_00,(char *)this_00);
    if (bVar5) {
      Error<>(this,"Invalid number format");
    }
LAB_001f6d57:
    if (1 < uVar8) {
      pcVar9 = "Invalid number format: too many decimal places";
      goto LAB_001f6d7d;
    }
  }
  if (uVar8 == 0) {
    local_58 = 0.0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)&local_50,pcVar9,
               this->m_current);
    bVar5 = StringToInteger(&local_50,(int64_t *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      MemFree(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (bVar5) {
      CreateSymbol(this,(int64_t)local_58);
      return;
    }
    pcVar9 = "Invalid integer format: unable to convert string to integer";
  }
  else {
    lVar7 = (long)this->m_current - (long)pcVar9;
    if (lVar7 < 2) {
      pcVar9 = "Invalid number format: no digits after decimal place";
LAB_001f6d7d:
      Error<>(this,pcVar9);
      return;
    }
    local_58 = 0.0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)&local_50,pcVar9,
               pcVar9 + lVar7);
    bVar5 = StringToNumber(&local_50,&local_58,International);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      MemFree(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (bVar5) {
      CreateSymbol(this,local_58);
      return;
    }
    pcVar9 = "Invalid number format: unable to convert string to double";
  }
  Error<>(this,pcVar9);
  return;
}

Assistant:

inline_t void Lexer::ParseNumber()
	{
		const char * startNum = m_current;
		int points = 0;
		if (*startNum == '.')
			points = 1;
		AdvanceCurrent();
		while (!IsEndOfText())
		{
			char c = *m_current;
			if (!IsNumber(c))
			{
				if (IsName(m_current))
				{
					Error("Invalid number format");
					break;
				}
				else
				{
					break;
				}
			}
			if (c == '.')
				++points;
			AdvanceCurrent();
		}
		if (points > 1)
			Error("Invalid number format: too many decimal places");
		else if (points == 0)
		{
			int64_t integer = 0;
			if (!StringToInteger(String(startNum, m_current - startNum), &integer))
			{
				Error("Invalid integer format: unable to convert string to integer");
				return;
			}
			CreateSymbol(integer);
		}
		else
		{
			if (m_current - startNum <= 1)
			{
				Error("Invalid number format: no digits after decimal place");
				return;
			}
			double number = 0.0f;
			if (!StringToNumber(String(startNum, m_current - startNum), &number))
			{
				Error("Invalid number format: unable to convert string to double");
				return;
			}
			CreateSymbol(number);
		}
	}